

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nbt_treeops.c
# Opt level: O0

int partial_strcmp(char *s1,size_t len,char *s2)

{
  int r;
  char *s2_local;
  size_t len_local;
  char *s1_local;
  
  if (s1 == (char *)0x0) {
    __assert_fail("s1",
                  "/workspace/llm4binary/github/license_c_cmakelists/chmod222[P]cNBT/nbt_treeops.c",
                  0x1b2,"int partial_strcmp(const char *, size_t, const char *)");
  }
  if (s2 == (char *)0x0) {
    s1_local._4_4_ = (uint)(len != 0);
  }
  else {
    s1_local._4_4_ = strncmp(s1,s2,len);
    if (s1_local._4_4_ == 0) {
      s1_local._4_4_ = (uint)(s2[len] != '\0');
    }
  }
  return s1_local._4_4_;
}

Assistant:

static int partial_strcmp(const char* s1, size_t len, const char* s2)
{
    assert(s1);

    if(s2 == NULL) return len != 0;

    int r;
    if((r = strncmp(s1, s2, len)) != 0)
        return r;

    /* at this point, the first `len' characters match. Check for NULL. */
    return s2[len] != '\0';
}